

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock_sse.c
# Opt level: O1

void uavs3d_deblock_hor_luma_sse(pel *src,int stride,int alpha,int beta,int flt_flag)

{
  pel *ppVar1;
  pel *ppVar2;
  long lVar3;
  pel *ppVar4;
  int iVar5;
  pel *ppVar6;
  pel *ppVar7;
  long lVar8;
  undefined1 auVar9 [16];
  short sVar10;
  undefined4 uVar11;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar12 [16];
  short sVar15;
  short sVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  short sVar23;
  short sVar29;
  short sVar31;
  short sVar33;
  short sVar35;
  short sVar37;
  short sVar39;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  short sVar41;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar57;
  short sVar63;
  short sVar65;
  short sVar67;
  short sVar69;
  short sVar71;
  short sVar73;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar75;
  undefined1 auVar61 [16];
  short sVar76;
  short sVar81;
  undefined1 in_XMM5 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar89;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  undefined1 auVar90 [16];
  short sVar102;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  short sVar110;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  short sVar119;
  undefined1 in_XMM10 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar123 [16];
  short sVar124;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  undefined1 in_XMM13 [16];
  undefined1 auVar125 [16];
  short sVar132;
  short sVar133;
  short sVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  undefined1 in_XMM14 [16];
  undefined1 auVar134 [16];
  short sVar142;
  undefined1 auVar135 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar143 [16];
  short sVar22;
  short sVar28;
  short sVar30;
  short sVar32;
  short sVar34;
  short sVar36;
  short sVar38;
  short sVar40;
  short sVar42;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar62;
  short sVar64;
  short sVar66;
  short sVar68;
  short sVar70;
  short sVar72;
  short sVar74;
  short sVar77;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  
  iVar5 = (flt_flag << 0x17) >> 0x1f;
  auVar9 = pshuflw(ZEXT416((uint)alpha),ZEXT416((uint)alpha),0);
  auVar12 = pshuflw(ZEXT416((uint)beta),ZEXT416((uint)beta),0);
  lVar3 = (long)(stride * 2);
  ppVar7 = src + -lVar3;
  lVar8 = (long)stride;
  ppVar2 = src + -lVar8;
  auVar43 = pmovzxbw(in_XMM3,*(undefined8 *)(src + -(long)(stride * 3)));
  auVar143 = pmovzxbw(in_XMM15,*(undefined8 *)ppVar7);
  auVar134 = pmovzxbw(in_XMM14,*(undefined8 *)ppVar2);
  auVar125 = pmovzxbw(in_XMM13,*(undefined8 *)src);
  auVar123 = pmovzxbw(in_XMM11,*(undefined8 *)(src + lVar8));
  auVar78 = pmovzxbw(in_XMM5,*(undefined8 *)(src + lVar3));
  uVar11 = auVar12._0_4_;
  auVar107._4_4_ = uVar11;
  auVar107._0_4_ = uVar11;
  auVar107._8_4_ = uVar11;
  auVar107._12_4_ = uVar11;
  auVar103._4_4_ = -(flt_flag & 1U);
  auVar103._0_4_ = -(flt_flag & 1U);
  auVar103._12_4_ = iVar5;
  auVar103._8_4_ = iVar5;
  sVar10 = auVar143._0_2_;
  sVar133 = auVar134._0_2_;
  auVar120._0_2_ = sVar10 - sVar133;
  sVar15 = auVar143._2_2_;
  sVar136 = auVar134._2_2_;
  auVar120._2_2_ = sVar15 - sVar136;
  sVar16 = auVar143._4_2_;
  sVar137 = auVar134._4_2_;
  auVar120._4_2_ = sVar16 - sVar137;
  sVar17 = auVar143._6_2_;
  sVar138 = auVar134._6_2_;
  auVar120._6_2_ = sVar17 - sVar138;
  sVar18 = auVar143._8_2_;
  sVar139 = auVar134._8_2_;
  auVar120._8_2_ = sVar18 - sVar139;
  sVar19 = auVar143._10_2_;
  sVar140 = auVar134._10_2_;
  auVar120._10_2_ = sVar19 - sVar140;
  sVar20 = auVar143._12_2_;
  sVar21 = auVar143._14_2_;
  sVar141 = auVar134._12_2_;
  auVar120._12_2_ = sVar20 - sVar141;
  sVar142 = auVar134._14_2_;
  auVar120._14_2_ = sVar21 - sVar142;
  auVar13 = pabsw(auVar120,auVar120);
  sVar22 = auVar123._0_2_;
  sVar124 = auVar125._0_2_;
  auVar24._0_2_ = sVar22 - sVar124;
  sVar28 = auVar123._2_2_;
  sVar126 = auVar125._2_2_;
  auVar24._2_2_ = sVar28 - sVar126;
  sVar30 = auVar123._4_2_;
  sVar127 = auVar125._4_2_;
  auVar24._4_2_ = sVar30 - sVar127;
  sVar32 = auVar123._6_2_;
  sVar128 = auVar125._6_2_;
  auVar24._6_2_ = sVar32 - sVar128;
  sVar34 = auVar123._8_2_;
  sVar129 = auVar125._8_2_;
  auVar24._8_2_ = sVar34 - sVar129;
  sVar36 = auVar123._10_2_;
  sVar130 = auVar125._10_2_;
  auVar24._10_2_ = sVar36 - sVar130;
  sVar38 = auVar123._12_2_;
  sVar40 = auVar123._14_2_;
  sVar131 = auVar125._12_2_;
  auVar24._12_2_ = sVar38 - sVar131;
  sVar132 = auVar125._14_2_;
  auVar24._14_2_ = sVar40 - sVar132;
  auVar25 = pabsw(auVar24,auVar24);
  sVar42 = auVar43._0_2_;
  auVar44._0_2_ = sVar42 - sVar133;
  sVar49 = auVar43._2_2_;
  auVar44._2_2_ = sVar49 - sVar136;
  sVar50 = auVar43._4_2_;
  auVar44._4_2_ = sVar50 - sVar137;
  sVar51 = auVar43._6_2_;
  auVar44._6_2_ = sVar51 - sVar138;
  sVar52 = auVar43._8_2_;
  auVar44._8_2_ = sVar52 - sVar139;
  sVar53 = auVar43._10_2_;
  auVar44._10_2_ = sVar53 - sVar140;
  sVar54 = auVar43._12_2_;
  sVar55 = auVar43._14_2_;
  auVar44._12_2_ = sVar54 - sVar141;
  auVar44._14_2_ = sVar55 - sVar142;
  auVar45 = pabsw(auVar44,auVar44);
  sVar56 = auVar78._0_2_;
  auVar58._0_2_ = sVar56 - sVar124;
  sVar62 = auVar78._2_2_;
  auVar58._2_2_ = sVar62 - sVar126;
  sVar64 = auVar78._4_2_;
  auVar58._4_2_ = sVar64 - sVar127;
  sVar66 = auVar78._6_2_;
  auVar58._6_2_ = sVar66 - sVar128;
  sVar68 = auVar78._8_2_;
  auVar58._8_2_ = sVar68 - sVar129;
  sVar70 = auVar78._10_2_;
  auVar58._10_2_ = sVar70 - sVar130;
  sVar72 = auVar78._12_2_;
  sVar74 = auVar78._14_2_;
  auVar58._12_2_ = sVar72 - sVar131;
  auVar58._14_2_ = sVar74 - sVar132;
  auVar59 = pabsw(auVar58,auVar58);
  sVar76 = auVar12._0_2_;
  sVar81 = auVar12._2_2_;
  auVar46._0_2_ = sVar133 - sVar124;
  auVar46._2_2_ = sVar136 - sVar126;
  auVar46._4_2_ = sVar137 - sVar127;
  auVar46._6_2_ = sVar138 - sVar128;
  auVar46._8_2_ = sVar139 - sVar129;
  auVar46._10_2_ = sVar140 - sVar130;
  auVar46._12_2_ = sVar141 - sVar131;
  auVar46._14_2_ = sVar142 - sVar132;
  auVar47 = pabsw(auVar46,auVar46);
  sVar110 = auVar9._0_2_;
  auVar12._0_2_ = -(ushort)(auVar47._0_2_ < sVar110);
  sVar113 = auVar9._2_2_;
  auVar12._2_2_ = -(ushort)(auVar47._2_2_ < sVar113);
  auVar12._4_2_ = -(ushort)(auVar47._4_2_ < sVar110);
  auVar12._6_2_ = -(ushort)(auVar47._6_2_ < sVar113);
  auVar12._8_2_ = -(ushort)(auVar47._8_2_ < sVar110);
  auVar12._10_2_ = -(ushort)(auVar47._10_2_ < sVar113);
  auVar12._12_2_ = -(ushort)(auVar47._12_2_ < sVar110);
  auVar12._14_2_ = -(ushort)(auVar47._14_2_ < sVar113);
  auVar120 = pmovsxbw(in_XMM10,0x202020202020202);
  sVar110 = auVar13._0_2_;
  auVar90._0_2_ = -(ushort)(sVar110 < sVar76);
  sVar113 = auVar13._2_2_;
  auVar90._2_2_ = -(ushort)(sVar113 < sVar81);
  sVar114 = auVar13._4_2_;
  auVar90._4_2_ = -(ushort)(sVar114 < sVar76);
  sVar115 = auVar13._6_2_;
  auVar90._6_2_ = -(ushort)(sVar115 < sVar81);
  sVar116 = auVar13._8_2_;
  auVar90._8_2_ = -(ushort)(sVar116 < sVar76);
  sVar117 = auVar13._10_2_;
  auVar90._10_2_ = -(ushort)(sVar117 < sVar81);
  sVar118 = auVar13._12_2_;
  auVar90._12_2_ = -(ushort)(sVar118 < sVar76);
  sVar119 = auVar13._14_2_;
  auVar90._14_2_ = -(ushort)(sVar119 < sVar81);
  auVar90 = auVar90 & auVar120;
  sVar89 = auVar90._0_2_ + (ushort)(auVar45._0_2_ < sVar76);
  sVar96 = auVar90._2_2_ + (ushort)(auVar45._2_2_ < sVar81);
  sVar97 = auVar90._4_2_ + (ushort)(auVar45._4_2_ < sVar76);
  sVar98 = auVar90._6_2_ + (ushort)(auVar45._6_2_ < sVar81);
  sVar99 = auVar90._8_2_ + (ushort)(auVar45._8_2_ < sVar76);
  sVar100 = auVar90._10_2_ + (ushort)(auVar45._10_2_ < sVar81);
  sVar101 = auVar90._12_2_ + (ushort)(auVar45._12_2_ < sVar76);
  sVar102 = auVar90._14_2_ + (ushort)(auVar45._14_2_ < sVar81);
  sVar23 = auVar25._0_2_;
  auVar60._0_2_ = -(ushort)(sVar23 < sVar76);
  sVar29 = auVar25._2_2_;
  auVar60._2_2_ = -(ushort)(sVar29 < sVar81);
  sVar31 = auVar25._4_2_;
  auVar60._4_2_ = -(ushort)(sVar31 < sVar76);
  sVar33 = auVar25._6_2_;
  auVar60._6_2_ = -(ushort)(sVar33 < sVar81);
  sVar35 = auVar25._8_2_;
  auVar60._8_2_ = -(ushort)(sVar35 < sVar76);
  sVar37 = auVar25._10_2_;
  auVar60._10_2_ = -(ushort)(sVar37 < sVar81);
  sVar39 = auVar25._12_2_;
  auVar60._12_2_ = -(ushort)(sVar39 < sVar76);
  sVar41 = auVar25._14_2_;
  auVar60._14_2_ = -(ushort)(sVar41 < sVar81);
  auVar60 = auVar60 & auVar120;
  auVar9 = psraw(auVar107,2);
  sVar57 = auVar60._0_2_ + (ushort)(auVar59._0_2_ < sVar76) + sVar89;
  sVar63 = auVar60._2_2_ + (ushort)(auVar59._2_2_ < sVar81) + sVar96;
  sVar65 = auVar60._4_2_ + (ushort)(auVar59._4_2_ < sVar76) + sVar97;
  sVar67 = auVar60._6_2_ + (ushort)(auVar59._6_2_ < sVar81) + sVar98;
  sVar69 = auVar60._8_2_ + (ushort)(auVar59._8_2_ < sVar76) + sVar99;
  sVar71 = auVar60._10_2_ + (ushort)(auVar59._10_2_ < sVar81) + sVar100;
  sVar73 = auVar60._12_2_ + (ushort)(auVar59._12_2_ < sVar76) + sVar101;
  sVar75 = auVar60._14_2_ + (ushort)(auVar59._14_2_ < sVar81) + sVar102;
  auVar122._0_2_ =
       -(ushort)(auVar9._0_2_ <
                (short)((ushort)(sVar110 < sVar23) * sVar23 | (ushort)(sVar110 >= sVar23) * sVar110)
                );
  auVar122._2_2_ =
       -(ushort)(auVar9._2_2_ <
                (short)((ushort)(sVar113 < sVar29) * sVar29 | (ushort)(sVar113 >= sVar29) * sVar113)
                );
  auVar122._4_2_ =
       -(ushort)(auVar9._4_2_ <
                (short)((ushort)(sVar114 < sVar31) * sVar31 | (ushort)(sVar114 >= sVar31) * sVar114)
                );
  auVar122._6_2_ =
       -(ushort)(auVar9._6_2_ <
                (short)((ushort)(sVar115 < sVar33) * sVar33 | (ushort)(sVar115 >= sVar33) * sVar115)
                );
  auVar122._8_2_ =
       -(ushort)(auVar9._8_2_ <
                (short)((ushort)(sVar116 < sVar35) * sVar35 | (ushort)(sVar116 >= sVar35) * sVar116)
                );
  auVar122._10_2_ =
       -(ushort)(auVar9._10_2_ <
                (short)((ushort)(sVar117 < sVar37) * sVar37 | (ushort)(sVar117 >= sVar37) * sVar117)
                );
  auVar122._12_2_ =
       -(ushort)(auVar9._12_2_ <
                (short)((ushort)(sVar118 < sVar39) * sVar39 | (ushort)(sVar118 >= sVar39) * sVar118)
                );
  auVar122._14_2_ =
       -(ushort)(auVar9._14_2_ <
                (short)((ushort)(sVar119 < sVar41) * sVar41 | (ushort)(sVar119 >= sVar41) * sVar119)
                );
  auVar12 = ~auVar122 & auVar12;
  auVar9._0_2_ = sVar10 - sVar22;
  auVar9._2_2_ = sVar15 - sVar28;
  auVar9._4_2_ = sVar16 - sVar30;
  auVar9._6_2_ = sVar17 - sVar32;
  auVar9._8_2_ = sVar18 - sVar34;
  auVar9._10_2_ = sVar19 - sVar36;
  auVar9._12_2_ = sVar20 - sVar38;
  auVar9._14_2_ = sVar21 - sVar40;
  auVar45 = pabsw(auVar47,auVar9);
  auVar47 = pmovsxbw(auVar25,0x303030303030303);
  auVar13._0_2_ = auVar47._0_2_ - auVar12._0_2_;
  auVar13._2_2_ = auVar47._2_2_ - auVar12._2_2_;
  auVar13._4_2_ = auVar47._4_2_ - auVar12._4_2_;
  auVar13._6_2_ = auVar47._6_2_ - auVar12._6_2_;
  auVar13._8_2_ = auVar47._8_2_ - auVar12._8_2_;
  auVar13._10_2_ = auVar47._10_2_ - auVar12._10_2_;
  auVar13._12_2_ = auVar47._12_2_ - auVar12._12_2_;
  auVar13._14_2_ = auVar47._14_2_ - auVar12._14_2_;
  sVar77 = auVar120._0_2_;
  auVar79._0_2_ = sVar77 + (ushort)(sVar10 == sVar133 && sVar22 == sVar124);
  sVar82 = auVar120._2_2_;
  auVar79._2_2_ = sVar82 + (ushort)(sVar15 == sVar136 && sVar28 == sVar126);
  sVar83 = auVar120._4_2_;
  auVar79._4_2_ = sVar83 + (ushort)(sVar16 == sVar137 && sVar30 == sVar127);
  sVar84 = auVar120._6_2_;
  auVar79._6_2_ = sVar84 + (ushort)(sVar17 == sVar138 && sVar32 == sVar128);
  sVar85 = auVar120._8_2_;
  auVar79._8_2_ = sVar85 + (ushort)(sVar18 == sVar139 && sVar34 == sVar129);
  sVar86 = auVar120._10_2_;
  auVar79._10_2_ = sVar86 + (ushort)(sVar19 == sVar140 && sVar36 == sVar130);
  sVar87 = auVar120._12_2_;
  sVar88 = auVar120._14_2_;
  auVar79._12_2_ = sVar87 + (ushort)(sVar20 == sVar141 && sVar38 == sVar131);
  auVar79._14_2_ = sVar88 + (ushort)(sVar21 == sVar142 && sVar40 == sVar132);
  auVar9 = pmovsxbw(auVar12,0x606060606060606);
  auVar14._0_2_ = -(ushort)(auVar9._0_2_ == sVar57);
  auVar14._2_2_ = -(ushort)(auVar9._2_2_ == sVar63);
  auVar14._4_2_ = -(ushort)(auVar9._4_2_ == sVar65);
  auVar14._6_2_ = -(ushort)(auVar9._6_2_ == sVar67);
  auVar14._8_2_ = -(ushort)(auVar9._8_2_ == sVar69);
  auVar14._10_2_ = -(ushort)(auVar9._10_2_ == sVar71);
  auVar14._12_2_ = -(ushort)(auVar9._12_2_ == sVar73);
  auVar14._14_2_ = -(ushort)(auVar9._14_2_ == sVar75);
  auVar9 = pmovsxbw(auVar13,0x505050505050505);
  auVar25._0_2_ = -(ushort)(auVar9._0_2_ == sVar57);
  auVar25._2_2_ = -(ushort)(auVar9._2_2_ == sVar63);
  auVar25._4_2_ = -(ushort)(auVar9._4_2_ == sVar65);
  auVar25._6_2_ = -(ushort)(auVar9._6_2_ == sVar67);
  auVar25._8_2_ = -(ushort)(auVar9._8_2_ == sVar69);
  auVar25._10_2_ = -(ushort)(auVar9._10_2_ == sVar71);
  auVar25._12_2_ = -(ushort)(auVar9._12_2_ == sVar73);
  auVar25._14_2_ = -(ushort)(auVar9._14_2_ == sVar75);
  auVar9 = pblendvb(auVar14 & auVar13,auVar79,auVar25);
  auVar12 = pmovsxbw(auVar79,0x101010101010101);
  auVar111._0_2_ = auVar12._0_2_ + (ushort)(sVar89 == sVar77);
  auVar111._2_2_ = auVar12._2_2_ + (ushort)(sVar96 == sVar82);
  auVar111._4_2_ = auVar12._4_2_ + (ushort)(sVar97 == sVar83);
  auVar111._6_2_ = auVar12._6_2_ + (ushort)(sVar98 == sVar84);
  auVar111._8_2_ = auVar12._8_2_ + (ushort)(sVar99 == sVar85);
  auVar111._10_2_ = auVar12._10_2_ + (ushort)(sVar100 == sVar86);
  auVar111._12_2_ = auVar12._12_2_ + (ushort)(sVar101 == sVar87);
  auVar111._14_2_ = auVar12._14_2_ + (ushort)(sVar102 == sVar88);
  auVar108._0_2_ = (ushort)-(ushort)(auVar45._0_2_ < sVar76) >> 0xf;
  auVar108._2_2_ = (ushort)-(ushort)(auVar45._2_2_ < sVar81) >> 0xf;
  auVar108._4_2_ = (ushort)-(ushort)(auVar45._4_2_ < sVar76) >> 0xf;
  auVar108._6_2_ = (ushort)-(ushort)(auVar45._6_2_ < sVar81) >> 0xf;
  auVar108._8_2_ = (ushort)-(ushort)(auVar45._8_2_ < sVar76) >> 0xf;
  auVar108._10_2_ = (ushort)-(ushort)(auVar45._10_2_ < sVar81) >> 0xf;
  auVar108._12_2_ = (ushort)-(ushort)(auVar45._12_2_ < sVar76) >> 0xf;
  auVar108._14_2_ = (ushort)-(ushort)(auVar45._14_2_ < sVar81) >> 0xf;
  auVar45._0_2_ = -(ushort)(sVar57 == 4);
  auVar45._2_2_ = -(ushort)(sVar63 == 4);
  auVar45._4_2_ = -(ushort)(sVar65 == 4);
  auVar45._6_2_ = -(ushort)(sVar67 == 4);
  auVar45._8_2_ = -(ushort)(sVar69 == 4);
  auVar45._10_2_ = -(ushort)(sVar71 == 4);
  auVar45._12_2_ = -(ushort)(sVar73 == 4);
  auVar45._14_2_ = -(ushort)(sVar75 == 4);
  auVar9 = pblendvb(auVar9,auVar111,auVar45);
  auVar61._0_2_ = -(ushort)(sVar57 == auVar47._0_2_);
  auVar61._2_2_ = -(ushort)(sVar63 == auVar47._2_2_);
  auVar61._4_2_ = -(ushort)(sVar65 == auVar47._4_2_);
  auVar61._6_2_ = -(ushort)(sVar67 == auVar47._6_2_);
  auVar61._8_2_ = -(ushort)(sVar69 == auVar47._8_2_);
  auVar61._10_2_ = -(ushort)(sVar71 == auVar47._10_2_);
  auVar61._12_2_ = -(ushort)(sVar73 == auVar47._12_2_);
  auVar61._14_2_ = -(ushort)(sVar75 == auVar47._14_2_);
  auVar9 = pblendvb(auVar9,auVar108,auVar61);
  auVar9 = auVar9 & auVar103;
  auVar48._0_2_ = sVar124 + sVar133 + sVar77;
  auVar48._2_2_ = sVar126 + sVar136 + sVar82;
  auVar48._4_2_ = sVar127 + sVar137 + sVar83;
  auVar48._6_2_ = sVar128 + sVar138 + sVar84;
  auVar48._8_2_ = sVar129 + sVar139 + sVar85;
  auVar48._10_2_ = sVar130 + sVar140 + sVar86;
  auVar48._12_2_ = sVar131 + sVar141 + sVar87;
  auVar48._14_2_ = sVar132 + sVar142 + sVar88;
  sVar110 = sVar133 * 2;
  sVar115 = sVar136 * 2;
  auVar109._2_2_ = sVar115;
  auVar109._0_2_ = sVar110;
  sVar118 = sVar137 * 2;
  auVar109._4_2_ = sVar118;
  sVar119 = sVar138 * 2;
  auVar109._6_2_ = sVar119;
  sVar23 = sVar139 * 2;
  auVar109._8_2_ = sVar23;
  sVar29 = sVar140 * 2;
  auVar109._10_2_ = sVar29;
  sVar31 = sVar141 * 2;
  auVar109._12_2_ = sVar31;
  sVar116 = sVar142 * 2;
  auVar109._14_2_ = sVar116;
  sVar57 = auVar9._0_2_;
  auVar80._0_2_ = -(ushort)(auVar12._0_2_ == sVar57);
  sVar63 = auVar9._2_2_;
  auVar80._2_2_ = -(ushort)(auVar12._2_2_ == sVar63);
  sVar65 = auVar9._4_2_;
  auVar80._4_2_ = -(ushort)(auVar12._4_2_ == sVar65);
  sVar67 = auVar9._6_2_;
  auVar80._6_2_ = -(ushort)(auVar12._6_2_ == sVar67);
  sVar69 = auVar9._8_2_;
  auVar80._8_2_ = -(ushort)(auVar12._8_2_ == sVar69);
  sVar71 = auVar9._10_2_;
  auVar80._10_2_ = -(ushort)(auVar12._10_2_ == sVar71);
  sVar73 = auVar9._12_2_;
  auVar80._12_2_ = -(ushort)(auVar12._12_2_ == sVar73);
  sVar75 = auVar9._14_2_;
  auVar80._14_2_ = -(ushort)(auVar12._14_2_ == sVar75);
  auVar91._0_2_ = (ushort)(auVar48._0_2_ + sVar110) >> 2;
  auVar91._2_2_ = (ushort)(auVar48._2_2_ + sVar115) >> 2;
  auVar91._4_2_ = (ushort)(auVar48._4_2_ + sVar118) >> 2;
  auVar91._6_2_ = (ushort)(auVar48._6_2_ + sVar119) >> 2;
  auVar91._8_2_ = (ushort)(auVar48._8_2_ + sVar23) >> 2;
  auVar91._10_2_ = (ushort)(auVar48._10_2_ + sVar29) >> 2;
  auVar91._12_2_ = (ushort)(auVar48._12_2_ + sVar31) >> 2;
  auVar91._14_2_ = (ushort)(auVar48._14_2_ + sVar116) >> 2;
  auVar13 = pblendvb(auVar134,auVar91,auVar80);
  sVar113 = sVar124 * 2;
  sVar114 = sVar126 * 2;
  sVar33 = sVar127 * 2;
  sVar35 = sVar128 * 2;
  sVar37 = sVar129 * 2;
  sVar39 = sVar130 * 2;
  sVar41 = sVar131 * 2;
  sVar117 = sVar132 * 2;
  auVar92._0_2_ = (ushort)(auVar48._0_2_ + sVar113) >> 2;
  auVar92._2_2_ = (ushort)(auVar48._2_2_ + sVar114) >> 2;
  auVar92._4_2_ = (ushort)(auVar48._4_2_ + sVar33) >> 2;
  auVar92._6_2_ = (ushort)(auVar48._6_2_ + sVar35) >> 2;
  auVar92._8_2_ = (ushort)(auVar48._8_2_ + sVar37) >> 2;
  auVar92._10_2_ = (ushort)(auVar48._10_2_ + sVar39) >> 2;
  auVar92._12_2_ = (ushort)(auVar48._12_2_ + sVar41) >> 2;
  auVar92._14_2_ = (ushort)(auVar48._14_2_ + sVar117) >> 2;
  auVar25 = pblendvb(auVar125,auVar92,auVar80);
  auVar12 = psllw(auVar134,3);
  auVar9 = pmovsxbw(auVar61,0x404040404040404);
  auVar121._0_2_ = -(ushort)(sVar77 == sVar57);
  auVar121._2_2_ = -(ushort)(sVar82 == sVar63);
  auVar121._4_2_ = -(ushort)(sVar83 == sVar65);
  auVar121._6_2_ = -(ushort)(sVar84 == sVar67);
  auVar121._8_2_ = -(ushort)(sVar85 == sVar69);
  auVar121._10_2_ = -(ushort)(sVar86 == sVar71);
  auVar121._12_2_ = -(ushort)(sVar87 == sVar73);
  auVar121._14_2_ = -(ushort)(sVar88 == sVar75);
  auVar104._0_2_ =
       (ushort)(auVar48._0_2_ * 2 + auVar9._0_2_ + auVar12._0_2_ + sVar10 * 2 + sVar124 + sVar10) >>
       4;
  auVar104._2_2_ =
       (ushort)(auVar48._2_2_ * 2 + auVar9._2_2_ + auVar12._2_2_ + sVar15 * 2 + sVar126 + sVar15) >>
       4;
  auVar104._4_2_ =
       (ushort)(auVar48._4_2_ * 2 + auVar9._4_2_ + auVar12._4_2_ + sVar16 * 2 + sVar127 + sVar16) >>
       4;
  auVar104._6_2_ =
       (ushort)(auVar48._6_2_ * 2 + auVar9._6_2_ + auVar12._6_2_ + sVar17 * 2 + sVar128 + sVar17) >>
       4;
  auVar104._8_2_ =
       (ushort)(auVar48._8_2_ * 2 + auVar9._8_2_ + auVar12._8_2_ + sVar18 * 2 + sVar129 + sVar18) >>
       4;
  auVar104._10_2_ =
       (ushort)(auVar48._10_2_ * 2 + auVar9._10_2_ + auVar12._10_2_ + sVar19 * 2 + sVar130 + sVar19)
       >> 4;
  auVar104._12_2_ =
       (ushort)(auVar48._12_2_ * 2 + auVar9._12_2_ + auVar12._12_2_ + sVar20 * 2 + sVar131 + sVar20)
       >> 4;
  auVar104._14_2_ =
       (ushort)(auVar48._14_2_ * 2 + auVar9._14_2_ + auVar12._14_2_ + sVar21 * 2 + sVar132 + sVar21)
       >> 4;
  auVar45 = pblendvb(auVar13,auVar104,auVar121);
  auVar12 = psllw(auVar125,3);
  auVar105._0_2_ =
       (ushort)(auVar12._0_2_ + sVar22 * 2 + sVar22 + sVar133 + auVar9._0_2_ + auVar48._0_2_ * 2) >>
       4;
  auVar105._2_2_ =
       (ushort)(auVar12._2_2_ + sVar28 * 2 + sVar28 + sVar136 + auVar9._2_2_ + auVar48._2_2_ * 2) >>
       4;
  auVar105._4_2_ =
       (ushort)(auVar12._4_2_ + sVar30 * 2 + sVar30 + sVar137 + auVar9._4_2_ + auVar48._4_2_ * 2) >>
       4;
  auVar105._6_2_ =
       (ushort)(auVar12._6_2_ + sVar32 * 2 + sVar32 + sVar138 + auVar9._6_2_ + auVar48._6_2_ * 2) >>
       4;
  auVar105._8_2_ =
       (ushort)(auVar12._8_2_ + sVar34 * 2 + sVar34 + sVar139 + auVar9._8_2_ + auVar48._8_2_ * 2) >>
       4;
  auVar105._10_2_ =
       (ushort)(auVar12._10_2_ + sVar36 * 2 + sVar36 + sVar140 + auVar9._10_2_ + auVar48._10_2_ * 2)
       >> 4;
  auVar105._12_2_ =
       (ushort)(auVar12._12_2_ + sVar38 * 2 + sVar38 + sVar141 + auVar9._12_2_ + auVar48._12_2_ * 2)
       >> 4;
  auVar105._14_2_ =
       (ushort)(auVar12._14_2_ + sVar40 * 2 + sVar40 + sVar142 + auVar9._14_2_ + auVar48._14_2_ * 2)
       >> 4;
  auVar25 = pblendvb(auVar25,auVar105,auVar121);
  auVar12 = psllw(auVar48,2);
  auVar13 = psllw(auVar143,2);
  auVar47._0_2_ = sVar22 + sVar42;
  auVar47._2_2_ = sVar28 + sVar49;
  auVar47._4_2_ = sVar30 + sVar50;
  auVar47._6_2_ = sVar32 + sVar51;
  auVar47._8_2_ = sVar34 + sVar52;
  auVar47._10_2_ = sVar36 + sVar53;
  auVar47._12_2_ = sVar38 + sVar54;
  auVar47._14_2_ = sVar40 + sVar55;
  auVar9 = pmovsxbw(auVar47,0x303030303030303);
  auVar59._0_2_ = -(ushort)(auVar9._0_2_ == sVar57);
  auVar59._2_2_ = -(ushort)(auVar9._2_2_ == sVar63);
  auVar59._4_2_ = -(ushort)(auVar9._4_2_ == sVar65);
  auVar59._6_2_ = -(ushort)(auVar9._6_2_ == sVar67);
  auVar59._8_2_ = -(ushort)(auVar9._8_2_ == sVar69);
  auVar59._10_2_ = -(ushort)(auVar9._10_2_ == sVar71);
  auVar59._12_2_ = -(ushort)(auVar9._12_2_ == sVar73);
  auVar59._14_2_ = -(ushort)(auVar9._14_2_ == sVar75);
  auVar93._0_2_ = (ushort)(auVar13._0_2_ + sVar110 + auVar47._0_2_ + auVar12._0_2_) >> 4;
  auVar93._2_2_ = (ushort)(auVar13._2_2_ + sVar115 + auVar47._2_2_ + auVar12._2_2_) >> 4;
  auVar93._4_2_ = (ushort)(auVar13._4_2_ + sVar118 + auVar47._4_2_ + auVar12._4_2_) >> 4;
  auVar93._6_2_ = (ushort)(auVar13._6_2_ + sVar119 + auVar47._6_2_ + auVar12._6_2_) >> 4;
  auVar93._8_2_ = (ushort)(auVar13._8_2_ + sVar23 + auVar47._8_2_ + auVar12._8_2_) >> 4;
  auVar93._10_2_ = (ushort)(auVar13._10_2_ + sVar29 + auVar47._10_2_ + auVar12._10_2_) >> 4;
  auVar93._12_2_ = (ushort)(auVar13._12_2_ + sVar31 + auVar47._12_2_ + auVar12._12_2_) >> 4;
  auVar93._14_2_ = (ushort)(auVar13._14_2_ + sVar116 + auVar47._14_2_ + auVar12._14_2_) >> 4;
  auVar13 = pblendvb(auVar45,auVar93,auVar59);
  auVar9 = psllw(auVar123,2);
  auVar94._0_2_ = (ushort)(auVar9._0_2_ + sVar113 + sVar56 + sVar10 + auVar12._0_2_) >> 4;
  auVar94._2_2_ = (ushort)(auVar9._2_2_ + sVar114 + sVar62 + sVar15 + auVar12._2_2_) >> 4;
  auVar94._4_2_ = (ushort)(auVar9._4_2_ + sVar33 + sVar64 + sVar16 + auVar12._4_2_) >> 4;
  auVar94._6_2_ = (ushort)(auVar9._6_2_ + sVar35 + sVar66 + sVar17 + auVar12._6_2_) >> 4;
  auVar94._8_2_ = (ushort)(auVar9._8_2_ + sVar37 + sVar68 + sVar18 + auVar12._8_2_) >> 4;
  auVar94._10_2_ = (ushort)(auVar9._10_2_ + sVar39 + sVar70 + sVar19 + auVar12._10_2_) >> 4;
  auVar94._12_2_ = (ushort)(auVar9._12_2_ + sVar41 + sVar72 + sVar20 + auVar12._12_2_) >> 4;
  auVar94._14_2_ = (ushort)(auVar9._14_2_ + sVar117 + sVar74 + sVar21 + auVar12._14_2_) >> 4;
  auVar25 = pblendvb(auVar25,auVar94,auVar59);
  auVar120 = psllw(auVar143,3);
  auVar9 = psllw(auVar134,2);
  auVar12 = pmovsxbw(auVar109,0x808080808080808);
  sVar76 = auVar12._0_2_;
  sVar77 = auVar12._2_2_;
  sVar81 = auVar12._4_2_;
  sVar82 = auVar12._6_2_;
  sVar83 = auVar12._8_2_;
  sVar84 = auVar12._10_2_;
  sVar85 = auVar12._12_2_;
  sVar86 = auVar12._14_2_;
  auVar134._0_2_ = (ushort)(sVar124 + sVar76 + auVar9._0_2_ + auVar120._0_2_ + sVar42 * 3) >> 4;
  auVar134._2_2_ = (ushort)(sVar126 + sVar77 + auVar9._2_2_ + auVar120._2_2_ + sVar49 * 3) >> 4;
  auVar134._4_2_ = (ushort)(sVar127 + sVar81 + auVar9._4_2_ + auVar120._4_2_ + sVar50 * 3) >> 4;
  auVar134._6_2_ = (ushort)(sVar128 + sVar82 + auVar9._6_2_ + auVar120._6_2_ + sVar51 * 3) >> 4;
  auVar134._8_2_ = (ushort)(sVar129 + sVar83 + auVar9._8_2_ + auVar120._8_2_ + sVar52 * 3) >> 4;
  auVar134._10_2_ = (ushort)(sVar130 + sVar84 + auVar9._10_2_ + auVar120._10_2_ + sVar53 * 3) >> 4;
  auVar134._12_2_ = (ushort)(sVar131 + sVar85 + auVar9._12_2_ + auVar120._12_2_ + sVar54 * 3) >> 4;
  auVar134._14_2_ = (ushort)(sVar132 + sVar86 + auVar9._14_2_ + auVar120._14_2_ + sVar55 * 3) >> 4;
  auVar122 = pmovsxbw(auVar43,0x404040404040404);
  auVar12 = pblendvb(auVar143,auVar134,auVar59);
  auVar45 = psllw(auVar123,3);
  auVar9 = psllw(auVar125,2);
  auVar125._0_2_ = (ushort)(sVar56 * 3 + sVar76 + auVar45._0_2_ + auVar9._0_2_ + sVar133) >> 4;
  auVar125._2_2_ = (ushort)(sVar62 * 3 + sVar77 + auVar45._2_2_ + auVar9._2_2_ + sVar136) >> 4;
  auVar125._4_2_ = (ushort)(sVar64 * 3 + sVar81 + auVar45._4_2_ + auVar9._4_2_ + sVar137) >> 4;
  auVar125._6_2_ = (ushort)(sVar66 * 3 + sVar82 + auVar45._6_2_ + auVar9._6_2_ + sVar138) >> 4;
  auVar125._8_2_ = (ushort)(sVar68 * 3 + sVar83 + auVar45._8_2_ + auVar9._8_2_ + sVar139) >> 4;
  auVar125._10_2_ = (ushort)(sVar70 * 3 + sVar84 + auVar45._10_2_ + auVar9._10_2_ + sVar140) >> 4;
  auVar125._12_2_ = (ushort)(sVar72 * 3 + sVar85 + auVar45._12_2_ + auVar9._12_2_ + sVar141) >> 4;
  auVar125._14_2_ = (ushort)(sVar74 * 3 + sVar86 + auVar45._14_2_ + auVar9._14_2_ + sVar142) >> 4;
  auVar9 = pblendvb(auVar123,auVar125,auVar59);
  ppVar6 = src + lVar8;
  auVar123._0_2_ = -(ushort)(sVar57 == auVar122._0_2_);
  auVar123._2_2_ = -(ushort)(sVar63 == auVar122._2_2_);
  auVar123._4_2_ = -(ushort)(sVar65 == auVar122._4_2_);
  auVar123._6_2_ = -(ushort)(sVar67 == auVar122._6_2_);
  auVar123._8_2_ = -(ushort)(sVar69 == auVar122._8_2_);
  auVar123._10_2_ = -(ushort)(sVar71 == auVar122._10_2_);
  auVar123._12_2_ = -(ushort)(sVar73 == auVar122._12_2_);
  auVar123._14_2_ = -(ushort)(sVar75 == auVar122._14_2_);
  ppVar1 = ppVar7;
  if (auVar123 != (undefined1  [16])0x0) {
    auVar59 = psllw(auVar48,3);
    auVar26._0_2_ = (ushort)(auVar47._0_2_ * 3 + auVar120._0_2_ + sVar110 + auVar59._0_2_) >> 5;
    auVar26._2_2_ = (ushort)(auVar47._2_2_ * 3 + auVar120._2_2_ + sVar115 + auVar59._2_2_) >> 5;
    auVar26._4_2_ = (ushort)(auVar47._4_2_ * 3 + auVar120._4_2_ + sVar118 + auVar59._4_2_) >> 5;
    auVar26._6_2_ = (ushort)(auVar47._6_2_ * 3 + auVar120._6_2_ + sVar119 + auVar59._6_2_) >> 5;
    auVar26._8_2_ = (ushort)(auVar47._8_2_ * 3 + auVar120._8_2_ + sVar23 + auVar59._8_2_) >> 5;
    auVar26._10_2_ = (ushort)(auVar47._10_2_ * 3 + auVar120._10_2_ + sVar29 + auVar59._10_2_) >> 5;
    auVar26._12_2_ = (ushort)(auVar47._12_2_ * 3 + auVar120._12_2_ + sVar31 + auVar59._12_2_) >> 5;
    auVar26._14_2_ = (ushort)(auVar47._14_2_ * 3 + auVar120._14_2_ + sVar116 + auVar59._14_2_) >> 5;
    auVar47 = pblendvb(auVar13,auVar26,auVar123);
    auVar27._0_2_ = (ushort)((sVar56 + sVar10) * 3 + auVar45._0_2_ + sVar113 + auVar59._0_2_) >> 5;
    auVar27._2_2_ = (ushort)((sVar62 + sVar15) * 3 + auVar45._2_2_ + sVar114 + auVar59._2_2_) >> 5;
    auVar27._4_2_ = (ushort)((sVar64 + sVar16) * 3 + auVar45._4_2_ + sVar33 + auVar59._4_2_) >> 5;
    auVar27._6_2_ = (ushort)((sVar66 + sVar17) * 3 + auVar45._6_2_ + sVar35 + auVar59._6_2_) >> 5;
    auVar27._8_2_ = (ushort)((sVar68 + sVar18) * 3 + auVar45._8_2_ + sVar37 + auVar59._8_2_) >> 5;
    auVar27._10_2_ = (ushort)((sVar70 + sVar19) * 3 + auVar45._10_2_ + sVar39 + auVar59._10_2_) >> 5
    ;
    auVar27._12_2_ = (ushort)((sVar72 + sVar20) * 3 + auVar45._12_2_ + sVar41 + auVar59._12_2_) >> 5
    ;
    auVar27._14_2_ =
         (ushort)((sVar74 + sVar21) * 3 + auVar45._14_2_ + sVar117 + auVar59._14_2_) >> 5;
    auVar45 = pblendvb(auVar25,auVar27,auVar123);
    auVar135._0_2_ = sVar133 + sVar10 + sVar42;
    auVar135._2_2_ = sVar136 + sVar15 + sVar49;
    auVar135._4_2_ = sVar137 + sVar16 + sVar50;
    auVar135._6_2_ = sVar138 + sVar17 + sVar51;
    auVar135._8_2_ = sVar139 + sVar18 + sVar52;
    auVar135._10_2_ = sVar140 + sVar19 + sVar53;
    auVar135._12_2_ = sVar141 + sVar20 + sVar54;
    auVar135._14_2_ = sVar142 + sVar21 + sVar55;
    auVar13 = psllw(auVar135,2);
    auVar95._0_2_ = (ushort)(sVar124 + sVar10 + sVar113 + sVar76 + auVar13._0_2_) >> 4;
    auVar95._2_2_ = (ushort)(sVar126 + sVar15 + sVar114 + sVar77 + auVar13._2_2_) >> 4;
    auVar95._4_2_ = (ushort)(sVar127 + sVar16 + sVar33 + sVar81 + auVar13._4_2_) >> 4;
    auVar95._6_2_ = (ushort)(sVar128 + sVar17 + sVar35 + sVar82 + auVar13._6_2_) >> 4;
    auVar95._8_2_ = (ushort)(sVar129 + sVar18 + sVar37 + sVar83 + auVar13._8_2_) >> 4;
    auVar95._10_2_ = (ushort)(sVar130 + sVar19 + sVar39 + sVar84 + auVar13._10_2_) >> 4;
    auVar95._12_2_ = (ushort)(sVar131 + sVar20 + sVar41 + sVar85 + auVar13._12_2_) >> 4;
    auVar95._14_2_ = (ushort)(sVar132 + sVar21 + sVar117 + sVar86 + auVar13._14_2_) >> 4;
    auVar13 = pblendvb(auVar12,auVar95,auVar123);
    auVar143._0_2_ = sVar124 + sVar22 + sVar56;
    auVar143._2_2_ = sVar126 + sVar28 + sVar62;
    auVar143._4_2_ = sVar127 + sVar30 + sVar64;
    auVar143._6_2_ = sVar128 + sVar32 + sVar66;
    auVar143._8_2_ = sVar129 + sVar34 + sVar68;
    auVar143._10_2_ = sVar130 + sVar36 + sVar70;
    auVar143._12_2_ = sVar131 + sVar38 + sVar72;
    auVar143._14_2_ = sVar132 + sVar40 + sVar74;
    auVar12 = psllw(auVar143,2);
    auVar112._0_2_ = (ushort)(sVar22 + sVar133 + sVar110 + sVar76 + auVar12._0_2_) >> 4;
    auVar112._2_2_ = (ushort)(sVar28 + sVar136 + sVar115 + sVar77 + auVar12._2_2_) >> 4;
    auVar112._4_2_ = (ushort)(sVar30 + sVar137 + sVar118 + sVar81 + auVar12._4_2_) >> 4;
    auVar112._6_2_ = (ushort)(sVar32 + sVar138 + sVar119 + sVar82 + auVar12._6_2_) >> 4;
    auVar112._8_2_ = (ushort)(sVar34 + sVar139 + sVar23 + sVar83 + auVar12._8_2_) >> 4;
    auVar112._10_2_ = (ushort)(sVar36 + sVar140 + sVar29 + sVar84 + auVar12._10_2_) >> 4;
    auVar112._12_2_ = (ushort)(sVar38 + sVar141 + sVar31 + sVar85 + auVar12._12_2_) >> 4;
    auVar112._14_2_ = (ushort)(sVar40 + sVar142 + sVar116 + sVar86 + auVar12._14_2_) >> 4;
    auVar25 = pblendvb(auVar9,auVar112,auVar123);
    auVar9 = pmovzxbw(auVar123,*(undefined8 *)(src + -(long)(stride << 2)));
    sVar110 = sVar124 + sVar133 + auVar122._0_2_;
    sVar113 = sVar126 + sVar136 + auVar122._2_2_;
    sVar114 = sVar127 + sVar137 + auVar122._4_2_;
    sVar115 = sVar128 + sVar138 + auVar122._6_2_;
    sVar116 = sVar129 + sVar139 + auVar122._8_2_;
    sVar117 = sVar130 + sVar140 + auVar122._10_2_;
    sVar118 = sVar131 + sVar141 + auVar122._12_2_;
    sVar119 = sVar132 + sVar142 + auVar122._14_2_;
    auVar106._0_2_ = (ushort)((sVar10 + sVar42 + auVar9._0_2_) * 2 + sVar110) >> 3;
    auVar106._2_2_ = (ushort)((sVar15 + sVar49 + auVar9._2_2_) * 2 + sVar113) >> 3;
    auVar106._4_2_ = (ushort)((sVar16 + sVar50 + auVar9._4_2_) * 2 + sVar114) >> 3;
    auVar106._6_2_ = (ushort)((sVar17 + sVar51 + auVar9._6_2_) * 2 + sVar115) >> 3;
    auVar106._8_2_ = (ushort)((sVar18 + sVar52 + auVar9._8_2_) * 2 + sVar116) >> 3;
    auVar106._10_2_ = (ushort)((sVar19 + sVar53 + auVar9._10_2_) * 2 + sVar117) >> 3;
    auVar106._12_2_ = (ushort)((sVar20 + sVar54 + auVar9._12_2_) * 2 + sVar118) >> 3;
    auVar106._14_2_ = (ushort)((sVar21 + sVar55 + auVar9._14_2_) * 2 + sVar119) >> 3;
    auVar12 = pblendvb(auVar43,auVar106,auVar123);
    auVar9 = pmovzxbw(auVar123,*(undefined8 *)(src + stride * 3));
    auVar43._0_2_ = (ushort)((sVar22 + sVar56 + auVar9._0_2_) * 2 + sVar110) >> 3;
    auVar43._2_2_ = (ushort)((sVar28 + sVar62 + auVar9._2_2_) * 2 + sVar113) >> 3;
    auVar43._4_2_ = (ushort)((sVar30 + sVar64 + auVar9._4_2_) * 2 + sVar114) >> 3;
    auVar43._6_2_ = (ushort)((sVar32 + sVar66 + auVar9._6_2_) * 2 + sVar115) >> 3;
    auVar43._8_2_ = (ushort)((sVar34 + sVar68 + auVar9._8_2_) * 2 + sVar116) >> 3;
    auVar43._10_2_ = (ushort)((sVar36 + sVar70 + auVar9._10_2_) * 2 + sVar117) >> 3;
    auVar43._12_2_ = (ushort)((sVar38 + sVar72 + auVar9._12_2_) * 2 + sVar118) >> 3;
    auVar43._14_2_ = (ushort)((sVar40 + sVar74 + auVar9._14_2_) * 2 + sVar119) >> 3;
    auVar9 = pblendvb(auVar78,auVar43,auVar123);
    sVar110 = auVar47._0_2_;
    sVar113 = auVar47._2_2_;
    sVar114 = auVar47._4_2_;
    sVar115 = auVar47._6_2_;
    sVar116 = auVar47._8_2_;
    sVar117 = auVar47._10_2_;
    sVar118 = auVar47._12_2_;
    sVar119 = auVar47._14_2_;
    *(ulong *)ppVar2 =
         CONCAT17((0 < sVar119) * (sVar119 < 0x100) * auVar47[0xe] - (0xff < sVar119),
                  CONCAT16((0 < sVar118) * (sVar118 < 0x100) * auVar47[0xc] - (0xff < sVar118),
                           CONCAT15((0 < sVar117) * (sVar117 < 0x100) * auVar47[10] -
                                    (0xff < sVar117),
                                    CONCAT14((0 < sVar116) * (sVar116 < 0x100) * auVar47[8] -
                                             (0xff < sVar116),
                                             CONCAT13((0 < sVar115) * (sVar115 < 0x100) * auVar47[6]
                                                      - (0xff < sVar115),
                                                      CONCAT12((0 < sVar114) * (sVar114 < 0x100) *
                                                               auVar47[4] - (0xff < sVar114),
                                                               CONCAT11((0 < sVar113) *
                                                                        (sVar113 < 0x100) *
                                                                        auVar47[2] -
                                                                        (0xff < sVar113),
                                                                        (0 < sVar110) *
                                                                        (sVar110 < 0x100) *
                                                                        auVar47[0] -
                                                                        (0xff < sVar110))))))));
    sVar110 = auVar45._0_2_;
    sVar113 = auVar45._2_2_;
    sVar114 = auVar45._4_2_;
    sVar115 = auVar45._6_2_;
    sVar116 = auVar45._8_2_;
    sVar117 = auVar45._10_2_;
    sVar118 = auVar45._12_2_;
    sVar119 = auVar45._14_2_;
    *(ulong *)src =
         CONCAT17((0 < sVar119) * (sVar119 < 0x100) * auVar45[0xe] - (0xff < sVar119),
                  CONCAT16((0 < sVar118) * (sVar118 < 0x100) * auVar45[0xc] - (0xff < sVar118),
                           CONCAT15((0 < sVar117) * (sVar117 < 0x100) * auVar45[10] -
                                    (0xff < sVar117),
                                    CONCAT14((0 < sVar116) * (sVar116 < 0x100) * auVar45[8] -
                                             (0xff < sVar116),
                                             CONCAT13((0 < sVar115) * (sVar115 < 0x100) * auVar45[6]
                                                      - (0xff < sVar115),
                                                      CONCAT12((0 < sVar114) * (sVar114 < 0x100) *
                                                               auVar45[4] - (0xff < sVar114),
                                                               CONCAT11((0 < sVar113) *
                                                                        (sVar113 < 0x100) *
                                                                        auVar45[2] -
                                                                        (0xff < sVar113),
                                                                        (0 < sVar110) *
                                                                        (sVar110 < 0x100) *
                                                                        auVar45[0] -
                                                                        (0xff < sVar110))))))));
    ppVar4 = src + lVar3;
    ppVar1 = src + -(long)(stride * 3);
    ppVar2 = ppVar7;
    src = ppVar6;
    ppVar6 = ppVar4;
  }
  sVar110 = auVar13._0_2_;
  sVar113 = auVar13._2_2_;
  sVar114 = auVar13._4_2_;
  sVar115 = auVar13._6_2_;
  sVar116 = auVar13._8_2_;
  sVar117 = auVar13._10_2_;
  sVar118 = auVar13._12_2_;
  sVar119 = auVar13._14_2_;
  *(ulong *)ppVar2 =
       CONCAT17((0 < sVar119) * (sVar119 < 0x100) * auVar13[0xe] - (0xff < sVar119),
                CONCAT16((0 < sVar118) * (sVar118 < 0x100) * auVar13[0xc] - (0xff < sVar118),
                         CONCAT15((0 < sVar117) * (sVar117 < 0x100) * auVar13[10] - (0xff < sVar117)
                                  ,CONCAT14((0 < sVar116) * (sVar116 < 0x100) * auVar13[8] -
                                            (0xff < sVar116),
                                            CONCAT13((0 < sVar115) * (sVar115 < 0x100) * auVar13[6]
                                                     - (0xff < sVar115),
                                                     CONCAT12((0 < sVar114) * (sVar114 < 0x100) *
                                                              auVar13[4] - (0xff < sVar114),
                                                              CONCAT11((0 < sVar113) *
                                                                       (sVar113 < 0x100) *
                                                                       auVar13[2] - (0xff < sVar113)
                                                                       ,(0 < sVar110) *
                                                                        (sVar110 < 0x100) *
                                                                        auVar13[0] -
                                                                        (0xff < sVar110))))))));
  sVar110 = auVar25._0_2_;
  sVar113 = auVar25._2_2_;
  sVar114 = auVar25._4_2_;
  sVar115 = auVar25._6_2_;
  sVar116 = auVar25._8_2_;
  sVar117 = auVar25._10_2_;
  sVar118 = auVar25._12_2_;
  sVar119 = auVar25._14_2_;
  *(ulong *)src =
       CONCAT17((0 < sVar119) * (sVar119 < 0x100) * auVar25[0xe] - (0xff < sVar119),
                CONCAT16((0 < sVar118) * (sVar118 < 0x100) * auVar25[0xc] - (0xff < sVar118),
                         CONCAT15((0 < sVar117) * (sVar117 < 0x100) * auVar25[10] - (0xff < sVar117)
                                  ,CONCAT14((0 < sVar116) * (sVar116 < 0x100) * auVar25[8] -
                                            (0xff < sVar116),
                                            CONCAT13((0 < sVar115) * (sVar115 < 0x100) * auVar25[6]
                                                     - (0xff < sVar115),
                                                     CONCAT12((0 < sVar114) * (sVar114 < 0x100) *
                                                              auVar25[4] - (0xff < sVar114),
                                                              CONCAT11((0 < sVar113) *
                                                                       (sVar113 < 0x100) *
                                                                       auVar25[2] - (0xff < sVar113)
                                                                       ,(0 < sVar110) *
                                                                        (sVar110 < 0x100) *
                                                                        auVar25[0] -
                                                                        (0xff < sVar110))))))));
  sVar110 = auVar12._0_2_;
  sVar113 = auVar12._2_2_;
  sVar114 = auVar12._4_2_;
  sVar115 = auVar12._6_2_;
  sVar116 = auVar12._8_2_;
  sVar117 = auVar12._10_2_;
  sVar118 = auVar12._12_2_;
  sVar119 = auVar12._14_2_;
  *(ulong *)ppVar1 =
       CONCAT17((0 < sVar119) * (sVar119 < 0x100) * auVar12[0xe] - (0xff < sVar119),
                CONCAT16((0 < sVar118) * (sVar118 < 0x100) * auVar12[0xc] - (0xff < sVar118),
                         CONCAT15((0 < sVar117) * (sVar117 < 0x100) * auVar12[10] - (0xff < sVar117)
                                  ,CONCAT14((0 < sVar116) * (sVar116 < 0x100) * auVar12[8] -
                                            (0xff < sVar116),
                                            CONCAT13((0 < sVar115) * (sVar115 < 0x100) * auVar12[6]
                                                     - (0xff < sVar115),
                                                     CONCAT12((0 < sVar114) * (sVar114 < 0x100) *
                                                              auVar12[4] - (0xff < sVar114),
                                                              CONCAT11((0 < sVar113) *
                                                                       (sVar113 < 0x100) *
                                                                       auVar12[2] - (0xff < sVar113)
                                                                       ,(0 < sVar110) *
                                                                        (sVar110 < 0x100) *
                                                                        auVar12[0] -
                                                                        (0xff < sVar110))))))));
  sVar110 = auVar9._0_2_;
  sVar113 = auVar9._2_2_;
  sVar114 = auVar9._4_2_;
  sVar115 = auVar9._6_2_;
  sVar116 = auVar9._8_2_;
  sVar117 = auVar9._10_2_;
  sVar118 = auVar9._12_2_;
  sVar119 = auVar9._14_2_;
  *(ulong *)ppVar6 =
       CONCAT17((0 < sVar119) * (sVar119 < 0x100) * auVar9[0xe] - (0xff < sVar119),
                CONCAT16((0 < sVar118) * (sVar118 < 0x100) * auVar9[0xc] - (0xff < sVar118),
                         CONCAT15((0 < sVar117) * (sVar117 < 0x100) * auVar9[10] - (0xff < sVar117),
                                  CONCAT14((0 < sVar116) * (sVar116 < 0x100) * auVar9[8] -
                                           (0xff < sVar116),
                                           CONCAT13((0 < sVar115) * (sVar115 < 0x100) * auVar9[6] -
                                                    (0xff < sVar115),
                                                    CONCAT12((0 < sVar114) * (sVar114 < 0x100) *
                                                             auVar9[4] - (0xff < sVar114),
                                                             CONCAT11((0 < sVar113) *
                                                                      (sVar113 < 0x100) * auVar9[2]
                                                                      - (0xff < sVar113),
                                                                      (0 < sVar110) *
                                                                      (sVar110 < 0x100) * auVar9[0]
                                                                      - (0xff < sVar110))))))));
  return;
}

Assistant:

void uavs3d_deblock_hor_luma_sse(pel *src, int stride, int alpha, int beta, int flt_flag)
{
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int inc4 = inc << 2;
    int flag0 = -(flt_flag & 1);
    int flag1 = -((flt_flag >> 8) & 1);

    __m128i TL0, TL1, TL2, TL3;
    __m128i TR0, TR1, TR2, TR3;
    __m128i TL0w, TL1w, TL2w, TR0w, TR1w, TR2w; //for swap
    __m128i V0, V1, V2, V3;
    __m128i T0, T1, T2, T3, T4, T5, T6, T7;
    __m128i M0, M1, M2;
    __m128i FLT_L, FLT_R, FLT, FS;
    __m128i FS3, FS4, FS5, FS6;

    __m128i ALPHA = _mm_set1_epi16((short)alpha);
    __m128i BETA = _mm_set1_epi16((short)beta);
    __m128i c_0 = _mm_set1_epi16(0);
    __m128i c_1 = _mm_set1_epi16(1);
    __m128i c_2 = _mm_set1_epi16(2);
    __m128i c_3 = _mm_set1_epi16(3);
    __m128i c_4 = _mm_set1_epi16(4);
    __m128i c_5 = _mm_set1_epi16(5);
    __m128i c_6 = _mm_set1_epi16(6);
    __m128i c_8 = _mm_set1_epi16(8);

    TL3 = _mm_loadl_epi64((__m128i*)(src - inc4));
    TL2 = _mm_loadl_epi64((__m128i*)(src - inc3));
    TL1 = _mm_loadl_epi64((__m128i*)(src - inc2));
    TL0 = _mm_loadl_epi64((__m128i*)(src - inc));
    TR0 = _mm_loadl_epi64((__m128i*)(src + 0));
    TR1 = _mm_loadl_epi64((__m128i*)(src + inc));
    TR2 = _mm_loadl_epi64((__m128i*)(src + inc2));
    TR3 = _mm_loadl_epi64((__m128i*)(src + inc3));

    TL3 = _mm_unpacklo_epi8(TL3, c_0);
    TL2 = _mm_unpacklo_epi8(TL2, c_0);
    TL1 = _mm_unpacklo_epi8(TL1, c_0);
    TL0 = _mm_unpacklo_epi8(TL0, c_0);
    TR0 = _mm_unpacklo_epi8(TR0, c_0);
    TR1 = _mm_unpacklo_epi8(TR1, c_0);
    TR2 = _mm_unpacklo_epi8(TR2, c_0);
    TR3 = _mm_unpacklo_epi8(TR3, c_0);


    M0 = _mm_set_epi32(flag1, flag1, flag0, flag0);

    T0 = _mm_subabs_epu16(TL1, TL0);
    T1 = _mm_subabs_epu16(TR1, TR0);
    FLT_L = _mm_and_si128(_mm_cmpgt_epi16(BETA, T0), c_2);
    FLT_R = _mm_and_si128(_mm_cmpgt_epi16(BETA, T1), c_2);

    T4 = _mm_subabs_epu16(TL2, TL0);
    T5 = _mm_subabs_epu16(TR2, TR0);
    M1 = _mm_cmpgt_epi16(BETA, T4);
    M2 = _mm_cmpgt_epi16(BETA, T5);

    T6 = _mm_subabs_epu16(TL0, TR0); // abs0
    T2 = _mm_cmpgt_epi16(ALPHA, T6); // abs0 < alpha
    T3 = _mm_srai_epi16(BETA, 2);    // Beta / 4 

    FLT_L = _mm_add_epi16(_mm_and_si128(M1, c_1), FLT_L);
    FLT_R = _mm_add_epi16(_mm_and_si128(M2, c_1), FLT_R);
    FLT = _mm_add_epi16(FLT_L, FLT_R);

    // !(COM_ABS(R0 - R1) <= Beta / 4 || COM_ABS(L0 - L1) <= Beta / 4)
    M1 = _mm_or_si128(_mm_cmpgt_epi16(T0, T3), _mm_cmpgt_epi16(T1, T3));
    M2 = _mm_and_si128(_mm_cmpeq_epi16(TR0, TR1), _mm_cmpeq_epi16(TL0, TL1));
    M1 = _mm_andnot_si128(M1, T2);

    T7 = _mm_subabs_epu16(TL1, TR1);
    FS6 = _mm_blendv_epi8(c_3, c_4, M1);
    FS5 = _mm_blendv_epi8(c_2, c_3, M2);
    FS4 = _mm_blendv_epi8(c_1, c_2, _mm_cmpeq_epi16(FLT_L, c_2));
    FS3 = _mm_blendv_epi8(c_0, c_1, _mm_cmpgt_epi16(BETA, T7));

    FS = _mm_blendv_epi8(c_0, FS6, _mm_cmpeq_epi16(FLT, c_6));
    FS = _mm_blendv_epi8(FS, FS5, _mm_cmpeq_epi16(FLT, c_5));
    FS = _mm_blendv_epi8(FS, FS4, _mm_cmpeq_epi16(FLT, c_4));
    FS = _mm_blendv_epi8(FS, FS3, _mm_cmpeq_epi16(FLT, c_3));

    FS = _mm_and_si128(FS, M0);

    TL0w = TL0;
    TL1w = TL1;
    TR0w = TR0;
    TR1w = TR1;

    /* fs == 1 */
    V0 = _mm_add_epi16(TL0w, TR0w);         // L0 + R0
    V1 = _mm_add_epi16(V0, c_2);            // L0 + R0 + 2
    V2 = _mm_slli_epi16(TL0w, 1);           // L0 << 1
    V3 = _mm_slli_epi16(TR0w, 1);

    T2 = _mm_cmpeq_epi16(FS, c_1);
    T0 = _mm_srli_epi16(_mm_add_epi16(V2, V1), 2);
    T1 = _mm_srli_epi16(_mm_add_epi16(V3, V1), 2);

    TL0 = _mm_blendv_epi8(TL0, T0, T2);
    TR0 = _mm_blendv_epi8(TR0, T1, T2);

    /* fs == 2 */
    V1 = _mm_slli_epi16(V1, 1);             // (L0 << 1) + (R0 << 1) + 4
    T0 = _mm_add_epi16(TL1w, TR0w);         // L1 + R0
    T1 = _mm_add_epi16(TR1w, TL0w);
    T2 = _mm_slli_epi16(TL1w, 1);           // L1 << 1
    T3 = _mm_slli_epi16(TR1w, 1);
    T0 = _mm_add_epi16(T0, V1);             // L1 + R0 + L0*2 + R0*2 + 4
    T1 = _mm_add_epi16(T1, V1);
    T4 = _mm_slli_epi16(TL0w, 3);           // L0*8
    T5 = _mm_slli_epi16(TR0w, 3);
    T0 = _mm_add_epi16(T0, T2);
    T1 = _mm_add_epi16(T1, T3);
    T4 = _mm_add_epi16(T4, c_4);
    T5 = _mm_add_epi16(T5, c_4);

    T2 = _mm_cmpeq_epi16(FS, c_2);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);
    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL0 = _mm_blendv_epi8(TL0, T0, T2);
    TR0 = _mm_blendv_epi8(TR0, T1, T2);

    /* fs == 3 */
    V1 = _mm_slli_epi16(V1, 1);             // (L0 << 2) + (R0 << 2) + 8
    T0 = _mm_slli_epi16(TL1w, 2);           // L1 << 2
    T1 = _mm_slli_epi16(TR1w, 2);
    T4 = _mm_add_epi16(TL2, TR1w);          // L2 + R1
    T5 = _mm_add_epi16(TR2, TL1w);

    T0 = _mm_add_epi16(T0, V2);             // (L1 << 2) + (L0 << 1)
    T1 = _mm_add_epi16(T1, V3);
    T4 = _mm_add_epi16(T4, V1);
    T5 = _mm_add_epi16(T5, V1);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);

    T6 = _mm_cmpeq_epi16(FS, c_3);
    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL0 = _mm_blendv_epi8(TL0, T0, T6);
    TR0 = _mm_blendv_epi8(TR0, T1, T6);

    T2 = _mm_add_epi16(TL2, TR0w);          // L2 + R0
    T3 = _mm_add_epi16(TR2, TL0w);
    T4 = _mm_slli_epi16(TL2, 1);
    T5 = _mm_slli_epi16(TR2, 1);
    T0 = _mm_slli_epi16(TL1w, 3);
    T1 = _mm_slli_epi16(TR1w, 3);
    T2 = _mm_add_epi16(T2, T4);             // L2 + R0 + L2*2
    T3 = _mm_add_epi16(T3, T5);
    T4 = _mm_slli_epi16(TL0w, 2);           // L0*4
    T5 = _mm_slli_epi16(TR0w, 2);
    T0 = _mm_add_epi16(T0, T2);
    T1 = _mm_add_epi16(T1, T3);
    T4 = _mm_add_epi16(T4, c_8);
    T5 = _mm_add_epi16(T5, c_8);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);

    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL1 = _mm_blendv_epi8(TL1, T0, T6);
    TR1 = _mm_blendv_epi8(TR1, T1, T6);

    FS = _mm_cmpeq_epi16(FS, c_4);

    if (!_mm_testz_si128(FS, _mm_set1_epi16(-1))) { /* fs == 4 */
        TL2w = TL2;
        TR2w = TR2;

        /* cal L0/R0 */
        V1 = _mm_slli_epi16(V1, 1);         // (L0 << 3) + (R0 << 3) + 16
        T0 = _mm_slli_epi16(TL1w, 3);       // L1 << 3
        T1 = _mm_slli_epi16(TR1w, 3);
        T2 = _mm_add_epi16(TL2w, TR1w);     // L2 + R1
        T3 = _mm_add_epi16(TR2w, TL1w);
        T0 = _mm_add_epi16(T0, V2);         // L0*2 + L1*8
        T1 = _mm_add_epi16(T1, V3);
        T4 = _mm_slli_epi16(T2, 1);
        T5 = _mm_slli_epi16(T3, 1);
        T0 = _mm_add_epi16(T0, V1);
        T1 = _mm_add_epi16(T1, V1);
        T2 = _mm_add_epi16(T2, T4);         // (L2 + R1) * 3
        T3 = _mm_add_epi16(T3, T5);

        T0 = _mm_add_epi16(T0, T2);
        T1 = _mm_add_epi16(T1, T3);
        T0 = _mm_srli_epi16(T0, 5);
        T1 = _mm_srli_epi16(T1, 5);

        TL0 = _mm_blendv_epi8(TL0, T0, FS);
        TR0 = _mm_blendv_epi8(TR0, T1, FS);

        /* cal L1/R1 */
        T4 = _mm_add_epi16(TL2w, TL1w);      // L2 + L1
        T5 = _mm_add_epi16(TR2w, TR1w);
        T2 = _mm_add_epi16(TR0w, TL1w);      // L1 + R0
        T3 = _mm_add_epi16(TL0w, TR1w);
        T0 = _mm_add_epi16(T4, TL0w);        // L0 + L1 + L2
        T1 = _mm_add_epi16(T5, TR0w);
        T2 = _mm_add_epi16(T2, V3);          // L1 + R0*3
        T3 = _mm_add_epi16(T3, V2);
        T0 = _mm_add_epi16(_mm_slli_epi16(T0, 2), T2);
        T1 = _mm_add_epi16(_mm_slli_epi16(T1, 2), T3);
        T0 = _mm_add_epi16(T0, c_8);
        T1 = _mm_add_epi16(T1, c_8);
        T0 = _mm_srli_epi16(T0, 4);
        T1 = _mm_srli_epi16(T1, 4);

        TL1 = _mm_blendv_epi8(TL1, T0, FS);
        TR1 = _mm_blendv_epi8(TR1, T1, FS);

        /* cal L2/R2 */
        T2 = _mm_add_epi16(T4, TL3);        // L1 + L2 + L3
        T3 = _mm_add_epi16(T5, TR3);
        T0 = _mm_add_epi16(V0, c_4);
        T2 = _mm_slli_epi16(T2, 1);
        T3 = _mm_slli_epi16(T3, 1);
        T2 = _mm_add_epi16(T2, T0);
        T3 = _mm_add_epi16(T3, T0);
        T0 = _mm_srli_epi16(T2, 3);
        T1 = _mm_srli_epi16(T3, 3);

        TL2 = _mm_blendv_epi8(TL2, T0, FS);
        TR2 = _mm_blendv_epi8(TR2, T1, FS);

        /* stroe result */
        _mm_storel_epi64((__m128i*)(src - inc), _mm_packus_epi16(TL0, c_0));
        _mm_storel_epi64((__m128i*)(src - 0), _mm_packus_epi16(TR0, c_0));

        _mm_storel_epi64((__m128i*)(src - inc2), _mm_packus_epi16(TL1, c_0));
        _mm_storel_epi64((__m128i*)(src + inc), _mm_packus_epi16(TR1, c_0));

        _mm_storel_epi64((__m128i*)(src - inc3), _mm_packus_epi16(TL2, c_0));
        _mm_storel_epi64((__m128i*)(src + inc2), _mm_packus_epi16(TR2, c_0));
    }
    else {
        /* stroe result */
        _mm_storel_epi64((__m128i*)(src - inc), _mm_packus_epi16(TL0, c_0));
        _mm_storel_epi64((__m128i*)(src - 0), _mm_packus_epi16(TR0, c_0));

        _mm_storel_epi64((__m128i*)(src - inc2), _mm_packus_epi16(TL1, c_0));
        _mm_storel_epi64((__m128i*)(src + inc), _mm_packus_epi16(TR1, c_0));
    }

}